

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# implot_items.cpp
# Opt level: O3

void ImPlot::PlotVLines<unsigned_long_long>
               (char *label_id,unsigned_long_long *xs,int count,int offset,int stride)

{
  ImPlotPlot *pIVar1;
  unsigned_long_long uVar2;
  double dVar3;
  double dVar4;
  ImPlotContext *pIVar5;
  bool bVar6;
  ImU32 col;
  ImDrawList *DrawList;
  int iVar7;
  ulong uVar8;
  ulong uVar9;
  undefined1 auVar10 [16];
  double dVar11;
  ImPlotLimits lims;
  TransformerLinLin local_8c;
  GetterXsYRef<unsigned_long_long> local_88;
  GetterXsYRef<unsigned_long_long> local_68;
  ImPlotLimits local_48;
  
  bVar6 = BeginItem(label_id,0);
  if (bVar6) {
    GetPlotLimits(&local_48,-1);
    pIVar5 = GImPlot;
    local_68.YRef = local_48.Y.Min;
    if (count == 0) {
      local_88.Offset = 0;
    }
    else {
      local_88.Offset = (offset % count + count) % count;
    }
    local_88.YRef = local_48.Y.Max;
    if ((0 < count) && (GImPlot->FitThisFrame != false)) {
      pIVar1 = GImPlot->CurrentPlot;
      iVar7 = 0;
      do {
        uVar2 = *(unsigned_long_long *)
                 ((long)xs +
                 (long)(((local_88.Offset + iVar7) % count + count) % count) * (long)stride);
        if ((uVar2 != 0) || (((pIVar1->XAxis).Flags & 0x20U) == 0)) {
          auVar10._8_4_ = (int)(uVar2 >> 0x20);
          auVar10._0_8_ = uVar2;
          auVar10._12_4_ = 0x45300000;
          dVar11 = (auVar10._8_8_ - 1.9342813113834067e+25) +
                   ((double)CONCAT44(0x43300000,(int)uVar2) - 4503599627370496.0);
          dVar3 = (pIVar5->ExtentsX).Min;
          dVar4 = (pIVar5->ExtentsX).Max;
          uVar8 = -(ulong)(dVar11 < dVar3);
          uVar9 = -(ulong)(dVar4 < dVar11);
          (pIVar5->ExtentsX).Min = (double)(~uVar8 & (ulong)dVar3 | (ulong)dVar11 & uVar8);
          (pIVar5->ExtentsX).Max = (double)(~uVar9 & (ulong)dVar4 | (ulong)dVar11 & uVar9);
        }
        iVar7 = iVar7 + 1;
      } while (count != iVar7);
    }
    local_88.Xs = xs;
    local_88.Count = count;
    local_88.Stride = stride;
    local_68.Xs = xs;
    local_68.Count = count;
    local_68.Offset = local_88.Offset;
    local_68.Stride = stride;
    DrawList = GetPlotDrawList();
    if ((pIVar5->NextItemData).RenderLine == true) {
      col = ImGui::GetColorU32((pIVar5->NextItemData).Colors);
      iVar7 = GImPlot->CurrentPlot->CurrentYAxis;
      switch(GImPlot->Scales[iVar7]) {
      case 0:
        local_8c.YAxis = iVar7;
        RenderLineSegments<ImPlot::GetterXsYRef<unsigned_long_long>,ImPlot::GetterXsYRef<unsigned_long_long>,ImPlot::TransformerLinLin>
                  (&local_68,&local_88,&local_8c,DrawList,(pIVar5->NextItemData).LineWeight,col);
        break;
      case 1:
        local_8c.YAxis = iVar7;
        RenderLineSegments<ImPlot::GetterXsYRef<unsigned_long_long>,ImPlot::GetterXsYRef<unsigned_long_long>,ImPlot::TransformerLogLin>
                  (&local_68,&local_88,(TransformerLogLin *)&local_8c,DrawList,
                   (pIVar5->NextItemData).LineWeight,col);
        break;
      case 2:
        local_8c.YAxis = iVar7;
        RenderLineSegments<ImPlot::GetterXsYRef<unsigned_long_long>,ImPlot::GetterXsYRef<unsigned_long_long>,ImPlot::TransformerLinLog>
                  (&local_68,&local_88,(TransformerLinLog *)&local_8c,DrawList,
                   (pIVar5->NextItemData).LineWeight,col);
        break;
      case 3:
        local_8c.YAxis = iVar7;
        RenderLineSegments<ImPlot::GetterXsYRef<unsigned_long_long>,ImPlot::GetterXsYRef<unsigned_long_long>,ImPlot::TransformerLogLog>
                  (&local_68,&local_88,(TransformerLogLog *)&local_8c,DrawList,
                   (pIVar5->NextItemData).LineWeight,col);
      }
    }
    pIVar5 = GImPlot;
    PopPlotClipRect();
    ImPlotNextItemData::Reset(&pIVar5->NextItemData);
    pIVar5->PreviousItem = pIVar5->CurrentItem;
    pIVar5->CurrentItem = (ImPlotItem *)0x0;
  }
  return;
}

Assistant:

void PlotVLines(const char* label_id, const T* xs, int count, int offset, int stride) {
    if (BeginItem(label_id, ImPlotCol_Line)) {
        const ImPlotLimits lims = GetPlotLimits();
        GetterXsYRef<T> get_min(xs,lims.Y.Min,count,offset,stride);
        GetterXsYRef<T> get_max(xs,lims.Y.Max,count,offset,stride);
        if (FitThisFrame()) {
            for (int i = 0; i < get_min.Count; ++i)
                FitPointX(get_min(i).x);
        }
        const ImPlotNextItemData& s = GetItemData();
        ImDrawList& DrawList = *GetPlotDrawList();
        // render stems
        if (s.RenderLine) {
            const ImU32 col_line = ImGui::GetColorU32(s.Colors[ImPlotCol_Line]);
            switch (GetCurrentScale()) {
                case ImPlotScale_LinLin: RenderLineSegments(get_min, get_max, TransformerLinLin(), DrawList, s.LineWeight, col_line); break;
                case ImPlotScale_LogLin: RenderLineSegments(get_min, get_max, TransformerLogLin(), DrawList, s.LineWeight, col_line); break;
                case ImPlotScale_LinLog: RenderLineSegments(get_min, get_max, TransformerLinLog(), DrawList, s.LineWeight, col_line); break;
                case ImPlotScale_LogLog: RenderLineSegments(get_min, get_max, TransformerLogLog(), DrawList, s.LineWeight, col_line); break;
            }
        }
        EndItem();
    }
}